

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypes.h
# Opt level: O0

bool FIX::operator<(DateTime *lhs,DateTime *rhs)

{
  DateTime *rhs_local;
  DateTime *lhs_local;
  
  if (lhs->m_date < rhs->m_date) {
    lhs_local._7_1_ = true;
  }
  else if (rhs->m_date < lhs->m_date) {
    lhs_local._7_1_ = false;
  }
  else if (lhs->m_time < rhs->m_time) {
    lhs_local._7_1_ = true;
  }
  else {
    lhs_local._7_1_ = false;
  }
  return lhs_local._7_1_;
}

Assistant:

inline bool operator<(const DateTime &lhs, const DateTime &rhs) {
  if (lhs.m_date < rhs.m_date) {
    return true;
  } else if (lhs.m_date > rhs.m_date) {
    return false;
  } else if (lhs.m_time < rhs.m_time) {
    return true;
  }
  return false;
}